

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O2

void __thiscall Js::BigUInt::Subtract(BigUInt *this,BigUInt *pbi)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x18d,"(pbi)","pbi");
    if (!bVar3) goto LAB_00609d79;
    *puVar6 = 0;
  }
  uVar4 = 1;
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x18e,"(this != pbi)","this != pbi");
    if (!bVar3) goto LAB_00609d79;
    *puVar6 = 0;
  }
  iVar9 = pbi->m_clu;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  if (this->m_clu < iVar9) {
LAB_00609d1d:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1b0,"(false)","Who\'s subtracting to negative?");
    if (!bVar3) {
LAB_00609d79:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
LAB_00609d5b:
    iVar5 = 0;
  }
  else {
    lVar8 = 0;
    for (lVar7 = 0; (lVar7 < iVar9 && (lVar7 < pbi->m_cluMax)); lVar7 = lVar7 + 1) {
      if (1 < uVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                    ,0x19a,"(wCarry == 0 || wCarry == 1)",
                                    "wCarry == 0 || wCarry == 1");
        if (!bVar3) goto LAB_00609d79;
        *puVar6 = 0;
      }
      uVar1 = *(uint *)((long)pbi->m_prglu + lVar8);
      if ((uVar1 != 0) || (uVar4 == 0)) {
        uVar4 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar8),uVar4 + ~uVar1);
      }
      iVar9 = pbi->m_clu;
      lVar8 = lVar8 + 4;
    }
    iVar9 = (int)lVar7;
    while (((uVar4 == 0 && (iVar9 < this->m_clu)) && (iVar9 < this->m_cluMax))) {
      uVar4 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar8),0xffffffff);
    }
    if (uVar4 == 0) goto LAB_00609d1d;
    if (this->m_clu != iVar9) goto LAB_00609d60;
    iVar9 = iVar9 + 1;
    do {
      iVar5 = iVar9 + -1;
      if (iVar5 < 1) goto LAB_00609d5b;
      uVar4 = iVar9 - 2;
      iVar9 = iVar5;
    } while (this->m_prglu[uVar4] == 0);
  }
  this->m_clu = iVar5;
LAB_00609d60:
  AssertValid(this,true);
  return;
}

Assistant:

void BigUInt::Subtract(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 ilu;
        int wCarry;
        uint32 luT;

        if (m_clu < pbi->m_clu)
            goto LNegative;

        wCarry = 1;
        for (ilu = 0; (ilu < pbi->m_clu) && (ilu < pbi->m_cluMax); ilu++)
        {
            Assert(wCarry == 0 || wCarry == 1);
            luT = pbi->m_prglu[ilu];

            // NOTE: We should really do:
            //    wCarry = AddLu(&m_prglu[ilu], wCarry);
            //    wCarry += AddLu(&m_prglu[ilu], ~luT);
            // The only case where this is different than
            //    wCarry = AddLu(&m_prglu[ilu], ~luT + wCarry);
            // is when luT == 0 and 1 == wCarry, in which case we don't
            // need to add anything and wCarry should still be 1, so we can
            // just skip the operations.

            if (0 != luT || 0 == wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], ~luT + wCarry);
        }
        while ((0 == wCarry) && (ilu < m_clu) && (ilu < m_cluMax))
            wCarry = NumberUtilities::AddLu(&m_prglu[ilu], 0xFFFFFFFF);

        if (0 == wCarry)
        {
LNegative:
            // pbi was bigger than this.
            AssertMsg(false, "Who's subtracting to negative?");
            m_clu = 0;
        }
        else if (ilu == m_clu)
        {
            // Trim off zeros.
            while (--ilu >= 0 && 0 == m_prglu[ilu])
                ;
            m_clu = ilu + 1;
        }

        AssertBi(this);
    }